

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O0

void __thiscall AbstractIsolineTracer<double>::common_init(AbstractIsolineTracer<double> *this)

{
  AbstractIsolineTracer<double> *this_local;
  
  this->mode = STEP_INVALID;
  this->m_allowable_error = -1.0;
  this->m_disable_polish = false;
  this->m_forwards_integration = true;
  std::__cxx11::string::operator=((string *)&this->m_termination_reason,"");
  this->m_premature_termination_code = 0;
  this->m_termination_requested = false;
  this->m_min_stepsize_counter = 0;
  this->m_c_parametric = 1.0;
  return;
}

Assistant:

void common_init() {
        mode = STEP_INVALID;
        m_allowable_error = -1; // Not specified
        m_disable_polish = false;
        m_forwards_integration = true;
        m_termination_reason = "";
        m_premature_termination_code = 0;
        m_termination_requested = false;
        m_min_stepsize_counter = 0;
        m_c_parametric = 1.0;
    }